

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

__sighandler_t signal(int __sig,__sighandler_t __handler)

{
  int *piVar1;
  _func_void_int *p_Var2;
  
  p_Var2 = (_func_void_int *)0xffffffffffffffff;
  if (__handler != (__sighandler_t)0xffffffffffffffff && 0 < __sig) {
    switch(__sig) {
    case 2:
      p_Var2 = _PDCLIB_sigint;
      _PDCLIB_sigint = (_func_void_int *)__handler;
      break;
    default:
      piVar1 = _PDCLIB_errno_func();
      *piVar1 = 0x16;
      break;
    case 4:
      p_Var2 = _PDCLIB_sigill;
      _PDCLIB_sigill = (_func_void_int *)__handler;
      break;
    case 6:
      p_Var2 = _PDCLIB_sigabrt;
      _PDCLIB_sigabrt = (_func_void_int *)__handler;
      break;
    case 8:
      p_Var2 = _PDCLIB_sigfpe;
      _PDCLIB_sigfpe = (_func_void_int *)__handler;
      break;
    case 0xb:
      p_Var2 = _PDCLIB_sigsegv;
      _PDCLIB_sigsegv = (_func_void_int *)__handler;
      break;
    case 0xf:
      p_Var2 = _PDCLIB_sigterm;
      _PDCLIB_sigterm = (_func_void_int *)__handler;
    }
  }
  return (__sighandler_t)p_Var2;
}

Assistant:

void ( *signal( int sig, void ( *func )( int ) ) )( int )
{
    void ( *oldhandler )( int );

    if ( sig <= 0 || func == SIG_ERR )
    {
        return SIG_ERR;
    }

    switch ( sig )
    {
        case SIGABRT:
            oldhandler = _PDCLIB_sigabrt;
            _PDCLIB_sigabrt = func;
            break;

        case SIGFPE:
            oldhandler = _PDCLIB_sigfpe;
            _PDCLIB_sigfpe = func;
            break;

        case SIGILL:
            oldhandler = _PDCLIB_sigill;
            _PDCLIB_sigill = func;
            break;

        case SIGINT:
            oldhandler = _PDCLIB_sigint;
            _PDCLIB_sigint = func;
            break;

        case SIGSEGV:
            oldhandler = _PDCLIB_sigsegv;
            _PDCLIB_sigsegv = func;
            break;

        case SIGTERM:
            oldhandler = _PDCLIB_sigterm;
            _PDCLIB_sigterm = func;
            break;

        default:
            /* The standard calls for an unspecified "positive value".
               Copying Linux' behaviour of setting EINVAL.
            */
            *_PDCLIB_errno_func() = _PDCLIB_EINVAL;
            return SIG_ERR;
    }

    return oldhandler;
}